

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_str2flag(char *str)

{
  char cVar1;
  int iVar2;
  char *in_RAX;
  long lVar3;
  uint uVar4;
  size_t __n;
  uint uVar5;
  char *end;
  char *local_38;
  
  uVar5 = 0;
  local_38 = in_RAX;
  lVar3 = strtol(str,&local_38,0);
  if (local_38 == str) {
    if (*str != '\0') {
      uVar5 = 0;
      do {
        __n = 0;
        while( true ) {
          local_38 = str + __n;
          cVar1 = str[__n];
          if ((cVar1 == '\0') || (cVar1 == ',')) break;
          __n = __n + 1;
        }
        iVar2 = strncasecmp("PAIRED",str,__n);
        if (((((__n != 6) || (uVar4 = 1, iVar2 != 0)) &&
             ((iVar2 = strncasecmp("PROPER_PAIR",str,__n), __n != 0xb || (uVar4 = 2, iVar2 != 0))))
            && ((((iVar2 = strncasecmp("UNMAP",str,__n), __n != 5 || (uVar4 = 4, iVar2 != 0)) &&
                 (((iVar2 = strncasecmp("MUNMAP",str,__n), __n != 6 || (uVar4 = 8, iVar2 != 0)) &&
                  ((iVar2 = strncasecmp("REVERSE",str,__n), __n != 7 || (uVar4 = 0x10, iVar2 != 0)))
                  ))) && (((iVar2 = strncasecmp("MREVERSE",str,__n), __n != 8 ||
                           (uVar4 = 0x20, iVar2 != 0)) &&
                          ((iVar2 = strncasecmp("READ1",str,__n), __n != 5 ||
                           (uVar4 = 0x40, iVar2 != 0)))))))) &&
           ((((iVar2 = strncasecmp("READ2",str,__n), __n != 5 || (uVar4 = 0x80, iVar2 != 0)) &&
             ((iVar2 = strncasecmp("SECONDARY",str,__n), __n != 9 || (uVar4 = 0x100, iVar2 != 0))))
            && (((iVar2 = strncasecmp("QCFAIL",str,__n), __n != 6 || (uVar4 = 0x200, iVar2 != 0)) &&
                ((iVar2 = strncasecmp("DUP",str,__n), __n != 3 || (uVar4 = 0x400, iVar2 != 0))))))))
        {
          iVar2 = strncasecmp("SUPPLEMENTARY",str,__n);
          if (__n != 0xd) {
            return -1;
          }
          uVar4 = 0x800;
          if (iVar2 != 0) {
            return -1;
          }
        }
        uVar5 = uVar5 | uVar4;
        str = str + __n + 1;
      } while (cVar1 != '\0');
    }
  }
  else {
    uVar5 = (uint)lVar3;
  }
  return uVar5;
}

Assistant:

int bam_str2flag(const char *str)
{
    char *end, *beg = (char*) str;
    long int flag = strtol(str, &end, 0);
    if ( end!=str ) return flag;    // the conversion was successful
    flag = 0;
    while ( *str )
    {
        end = beg;
        while ( *end && *end!=',' ) end++;
        if ( !STRNCMP("PAIRED",beg,end-beg) ) flag |= BAM_FPAIRED;
        else if ( !STRNCMP("PROPER_PAIR",beg,end-beg) ) flag |= BAM_FPROPER_PAIR;
        else if ( !STRNCMP("UNMAP",beg,end-beg) ) flag |= BAM_FUNMAP;
        else if ( !STRNCMP("MUNMAP",beg,end-beg) ) flag |= BAM_FMUNMAP;
        else if ( !STRNCMP("REVERSE",beg,end-beg) ) flag |= BAM_FREVERSE;
        else if ( !STRNCMP("MREVERSE",beg,end-beg) ) flag |= BAM_FMREVERSE;
        else if ( !STRNCMP("READ1",beg,end-beg) ) flag |= BAM_FREAD1;
        else if ( !STRNCMP("READ2",beg,end-beg) ) flag |= BAM_FREAD2;
        else if ( !STRNCMP("SECONDARY",beg,end-beg) ) flag |= BAM_FSECONDARY;
        else if ( !STRNCMP("QCFAIL",beg,end-beg) ) flag |= BAM_FQCFAIL;
        else if ( !STRNCMP("DUP",beg,end-beg) ) flag |= BAM_FDUP;
        else if ( !STRNCMP("SUPPLEMENTARY",beg,end-beg) ) flag |= BAM_FSUPPLEMENTARY;
        else return -1;
        if ( !*end ) break;
        beg = end + 1;
    }
    return flag;
}